

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcRelDefinesByProperties *in;
  
  in = (IfcRelDefinesByProperties *)operator_new(0xf0);
  *(undefined ***)&in->field_0xd8 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0xe0 = 0;
  *(char **)&in->field_0xe8 = "IfcRelDefinesByProperties";
  Assimp::IFC::Schema_2x3::IfcRelDefines::IfcRelDefines
            ((IfcRelDefines *)in,&PTR_construction_vtable_24__00868b40);
  *(undefined8 *)&(in->super_IfcRelDefines).field_0xc8 = 0;
  *(undefined8 *)&(in->super_IfcRelDefines).field_0xd0 = 0;
  *(undefined ***)&in->super_IfcRelDefines = &PTR__IfcRelDefinesByProperties_00868a88;
  *(undefined ***)&in->field_0xd8 = &PTR__IfcRelDefinesByProperties_00868b28;
  *(undefined ***)&(in->super_IfcRelDefines).field_0x88 = &PTR__IfcRelDefinesByProperties_00868ab0;
  (in->super_IfcRelDefines).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcRelDefinesByProperties_00868ad8;
  *(undefined ***)&(in->super_IfcRelDefines).field_0xc0 = &PTR__IfcRelDefinesByProperties_00868b00;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties>(db,params,in);
  return (Object *)
         (&(in->super_IfcRelDefines).field_0x0 +
         *(long *)(*(long *)&in->super_IfcRelDefines + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }